

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall
Console::Prompt::Private::concharArrayToString(Private *this,conchar *data,usize len,String *result)

{
  conchar *pcVar1;
  conchar *i;
  
  String::clear(result);
  if (this->utf8 == true) {
    String::reserve(result,len * 4);
    Unicode::append(data,len,result);
    return;
  }
  String::reserve(result,len);
  pcVar1 = data + len;
  for (; data < pcVar1; data = data + 1) {
    String::append(result,(char)*data);
  }
  return;
}

Assistant:

void concharArrayToString(const conchar* data, usize len, String& result)
  {
    result.clear();
#ifdef _MSC_VER
    result.append(data, len);
#else
    if(utf8)
    {
      result.reserve(len * sizeof(uint32));
      Unicode::append(data, len, result);
    }
    else
    {
      result.reserve(len);
      for(const conchar* i = data, * end = data + len; i < end; ++i)
        result.append((const char&)*i);
    }
#endif
  }